

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFSPermissions.cxx
# Opt level: O2

bool cmFSPermissions::stringToModeT(string *arg,mode_t *permissions)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = std::operator==(arg,"OWNER_READ");
  uVar2 = 0x100;
  if (!bVar1) {
    bVar1 = std::operator==(arg,"OWNER_WRITE");
    uVar2 = 0x80;
    if (!bVar1) {
      bVar1 = std::operator==(arg,"OWNER_EXECUTE");
      if (bVar1) {
        uVar2 = 0x40;
      }
      else {
        bVar1 = std::operator==(arg,"GROUP_READ");
        if (bVar1) {
          uVar2 = 0x20;
        }
        else {
          bVar1 = std::operator==(arg,"GROUP_WRITE");
          if (bVar1) {
            uVar2 = 0x10;
          }
          else {
            bVar1 = std::operator==(arg,"GROUP_EXECUTE");
            if (bVar1) {
              uVar2 = 8;
            }
            else {
              bVar1 = std::operator==(arg,"WORLD_READ");
              if (bVar1) {
                uVar2 = 4;
              }
              else {
                bVar1 = std::operator==(arg,"WORLD_WRITE");
                if (bVar1) {
                  uVar2 = 2;
                }
                else {
                  bVar1 = std::operator==(arg,"WORLD_EXECUTE");
                  if (bVar1) {
                    uVar2 = 1;
                  }
                  else {
                    bVar1 = std::operator==(arg,"SETUID");
                    uVar2 = 0x800;
                    if (!bVar1) {
                      bVar1 = std::operator==(arg,"SETGID");
                      uVar2 = 0x400;
                      if (!bVar1) {
                        return false;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *permissions = *permissions | uVar2;
  return true;
}

Assistant:

bool cmFSPermissions::stringToModeT(std::string const& arg,
                                    mode_t& permissions)
{
  if (arg == "OWNER_READ") {
    permissions |= mode_owner_read;
  } else if (arg == "OWNER_WRITE") {
    permissions |= mode_owner_write;
  } else if (arg == "OWNER_EXECUTE") {
    permissions |= mode_owner_execute;
  } else if (arg == "GROUP_READ") {
    permissions |= mode_group_read;
  } else if (arg == "GROUP_WRITE") {
    permissions |= mode_group_write;
  } else if (arg == "GROUP_EXECUTE") {
    permissions |= mode_group_execute;
  } else if (arg == "WORLD_READ") {
    permissions |= mode_world_read;
  } else if (arg == "WORLD_WRITE") {
    permissions |= mode_world_write;
  } else if (arg == "WORLD_EXECUTE") {
    permissions |= mode_world_execute;
  } else if (arg == "SETUID") {
    permissions |= mode_setuid;
  } else if (arg == "SETGID") {
    permissions |= mode_setgid;
  } else {
    return false;
  }
  return true;
}